

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int saxParseTest(char *filename,char *result,char *err,int options)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  char *extraout_RDX;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  debugContext userData;
  uint uStack_ac;
  char *pcStack_a8;
  char *pcStack_a0;
  char *pcStack_98;
  char *pcStack_90;
  char *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  nb_tests = nb_tests + 1;
  pcVar11 = temp_directory;
  pcVar10 = filename;
  uVar8 = options;
  pcVar4 = resultFilename(filename,temp_directory,".res");
  if (pcVar4 == (char *)0x0) {
    saxParseTest_cold_2();
    nb_tests = nb_tests + 1;
    iVar3 = loadMem(pcVar10,&pcStack_a8,(int *)&uStack_ac);
    pcVar4 = pcStack_a8;
    uVar1 = uStack_ac;
    if (iVar3 == 0) {
      uVar12 = (ulong)(int)uStack_ac;
      uVar9 = 4;
      if ((int)uStack_ac < 4) {
        uVar9 = (ulong)uStack_ac;
      }
      pcStack_a0 = pcVar10;
      pcStack_98 = extraout_RDX;
      pcStack_90 = pcVar11;
      if ((uVar8 >> 0x1e & 1) == 0) {
        lVar7 = xmlCreatePushParserCtxt(0,0,pcStack_a8,uVar9,pcVar10);
      }
      else {
        lVar7 = htmlCreatePushParserCtxt(0,0,pcStack_a8,uVar9,pcVar10,0);
      }
      xmlCtxtSetErrorHandler(lVar7,testStructuredErrorHandler,0);
      xmlCtxtUseOptions(lVar7,uVar8);
      if ((int)uVar9 + 0x400 < (int)uVar1) {
        uVar13 = 4;
        if ((long)uVar12 < 4) {
          uVar13 = uVar12;
        }
        do {
          uVar9 = uVar13 + 0x400;
          if ((uVar8 >> 0x1e & 1) == 0) {
            xmlParseChunk();
            if ((long)uVar12 <= (long)uVar9) goto LAB_0010987a;
          }
          else {
            htmlParseChunk(lVar7,pcVar4 + uVar13,0x400,0);
            if ((long)uVar12 <= (long)uVar9) goto LAB_001098b3;
          }
          lVar14 = uVar13 + 0x800;
          uVar13 = uVar9;
        } while (lVar14 < (long)uVar12);
      }
      if ((uVar8 >> 0x1e & 1) == 0) {
        xmlParseChunk();
LAB_0010987a:
        uVar6 = *(undefined8 *)(lVar7 + 0x10);
        iVar3 = *(int *)(lVar7 + 0x18);
        xmlFreeParserCtxt(lVar7);
        free(pcVar4);
        if (iVar3 == 0) {
          xmlFreeDoc(uVar6);
          pcVar11 = "Failed to parse %s\n";
          pcVar10 = pcStack_a0;
          goto LAB_001099b8;
        }
        xmlDocDumpMemory(uVar6,&pcStack_a8,&uStack_ac);
      }
      else {
        htmlParseChunk(lVar7,pcVar4 + (int)uVar9,uVar1 - (int)uVar9,1);
LAB_001098b3:
        uVar6 = *(undefined8 *)(lVar7 + 0x10);
        xmlFreeParserCtxt(lVar7);
        free(pcVar4);
        htmlDocDumpMemory(uVar6,&pcStack_a8,&uStack_ac);
      }
      pcVar10 = pcStack_a0;
      xmlFreeDoc(uVar6);
      pcVar11 = pcStack_90;
      iVar3 = compareFileMem(pcStack_90,pcStack_a8,uStack_ac);
      if ((pcStack_a8 == (char *)0x0) || (iVar3 != 0)) {
        if (pcStack_a8 != (char *)0x0) {
          (*_xmlFree)();
        }
        fprintf(_stderr,"Result for %s failed in %s\n",pcVar10,pcVar11);
        return -1;
      }
      (*_xmlFree)();
      if (pcStack_98 == (char *)0x0) {
        return 0;
      }
      iVar3 = compareFileMem(pcStack_98,testErrors,testErrorsSize);
      if (iVar3 == 0) {
        return 0;
      }
      pcVar11 = "Error for %s failed\n";
    }
    else {
      pcVar11 = "Failed to load %s\n";
    }
LAB_001099b8:
    fprintf(_stderr,pcVar11,pcVar10);
    return -1;
  }
  SAXdebug = (FILE *)fopen64(pcVar4,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    saxParseTest_cold_1();
    return -1;
  }
  if (((uint)options >> 0x1e & 1) == 0) {
    puVar5 = (undefined8 *)xmlCreateFileParserCtxt(filename);
    memcpy((void *)*puVar5,&emptySAXHandlerStruct,0x100);
    xmlCtxtUseOptions(puVar5,options);
    xmlParseDocument(puVar5);
    if (*(int *)(puVar5 + 3) != 0) {
      xmlFreeDoc(puVar5[2]);
      xmlFreeParserCtxt(puVar5);
LAB_00109613:
      puVar5 = (undefined8 *)xmlCreateFileParserCtxt(filename);
      if (((uint)options >> 9 & 1) == 0) {
        memcpy((void *)*puVar5,&debugSAX2HandlerStruct,0x100);
      }
      else {
        memcpy((void *)*puVar5,&debugSAXHandlerStruct,0x100);
        options = options + -0x200;
      }
      iVar3 = 0;
      local_48 = filename;
      local_40 = xmlHashCreate(0);
      local_38 = xmlHashCreate(0);
      puVar5[1] = &local_48;
      xmlCtxtUseOptions(puVar5,options);
      xmlParseDocument(puVar5);
      if (*(int *)(puVar5 + 3) == 0) {
        iVar3 = *(int *)(puVar5 + 0x11);
      }
      xmlHashFree(local_40,hashFreeEntity);
      xmlHashFree(local_38,hashFreeEntity);
      xmlFreeDoc(puVar5[2]);
      xmlFreeParserCtxt(puVar5);
      goto LAB_001096d2;
    }
    iVar3 = *(int *)(puVar5 + 0x11);
    xmlFreeDoc(puVar5[2]);
    xmlFreeParserCtxt(puVar5);
    if (iVar3 == 0) goto LAB_00109613;
    if (iVar3 == 0x1a) {
      fprintf((FILE *)SAXdebug,"xmlParseDocument returned error %d\n",0x1a);
      goto LAB_00109613;
    }
    pcVar10 = "Failed to parse %s\n";
  }
  else {
    iVar3 = 0;
    uVar6 = htmlNewSAXParserCtxt(&emptySAXHandlerStruct,0);
    htmlCtxtReadFile(uVar6,filename,0,options);
    htmlFreeParserCtxt(uVar6);
    uVar6 = htmlNewSAXParserCtxt(&debugHTMLSAXHandlerStruct,0);
    htmlCtxtReadFile(uVar6,filename,0,options);
    htmlFreeParserCtxt(uVar6);
LAB_001096d2:
    fclose((FILE *)SAXdebug);
    iVar2 = compareFiles(pcVar4,result);
    if (iVar2 == 0) goto LAB_001096ed;
    pcVar10 = "Got a difference for %s\n";
  }
  fprintf(_stderr,pcVar10,filename);
  iVar3 = 1;
LAB_001096ed:
  unlink(pcVar4);
  free(pcVar4);
  return iVar3;
}

Assistant:

static int
saxParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
             int options) {
    int ret;
    char *temp;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(emptySAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);
        memcpy(ctxt->sax, emptySAXHandler, sizeof(xmlSAXHandler));
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    if (ret == XML_ERR_UNDECLARED_ENTITY) {
        fprintf(SAXdebug, "xmlParseDocument returned error %d\n", ret);
        ret = 0;
    }
    if (ret != 0) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	ret = 1;
	goto done;
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(debugHTMLSAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        debugContext userData;
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);

        if (options & XML_PARSE_SAX1) {
            memcpy(ctxt->sax, debugSAXHandler, sizeof(xmlSAXHandler));
            options -= XML_PARSE_SAX1;
        } else {
            memcpy(ctxt->sax, debugSAX2Handler, sizeof(xmlSAXHandler));
        }
        userData.filename = filename;
        userData.generalEntities = xmlHashCreate(0);
        userData.parameterEntities = xmlHashCreate(0);
        ctxt->userData = &userData;
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlHashFree(userData.generalEntities, hashFreeEntity);
        xmlHashFree(userData.parameterEntities, hashFreeEntity);
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    fclose(SAXdebug);
    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

done:
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}